

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb_a<ncnn::BinaryOp_x86_fma_functor::binary_op_add>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int in_ECX;
  undefined8 *in_RDX;
  float *in_RSI;
  undefined8 *in_RDI;
  int in_R8D;
  __m128 _outp_2;
  __m128 _b_2;
  __m256 _outp_1;
  __m256 _b_1;
  __m128 _b1;
  __m128 _b0;
  __m256 _p_256;
  __m128 _p_1;
  int i_1;
  __m256 _outp;
  __m256 _b;
  __m256 _p;
  int i;
  binary_op_add op;
  int local_344;
  int local_2e0;
  undefined8 *local_2d0;
  float *local_2c8;
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  
  local_2d0 = in_RDX;
  local_2c8 = in_RSI;
  if (in_R8D == 8) {
    local_2e0 = 0;
    uVar5 = *in_RDI;
    uVar6 = in_RDI[1];
    uVar7 = in_RDI[2];
    uVar8 = in_RDI[3];
    for (; local_2e0 < in_ECX; local_2e0 = local_2e0 + 1) {
      fVar1 = *local_2c8;
      auVar3 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)fVar1),0x20);
      auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)fVar1),0x30);
      auVar4 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar1),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar1),0x30);
      local_1a0 = (float)uVar5;
      fStack_19c = (float)((ulong)uVar5 >> 0x20);
      fStack_198 = (float)uVar6;
      fStack_194 = (float)((ulong)uVar6 >> 0x20);
      fStack_190 = (float)uVar7;
      fStack_18c = (float)((ulong)uVar7 >> 0x20);
      fStack_188 = (float)uVar8;
      fStack_184 = (float)((ulong)uVar8 >> 0x20);
      local_1c0 = auVar4._0_4_;
      fStack_1bc = auVar4._4_4_;
      fStack_1b8 = auVar4._8_4_;
      fStack_1b4 = auVar4._12_4_;
      fStack_1b0 = auVar3._0_4_;
      fStack_1ac = auVar3._4_4_;
      fStack_1a8 = auVar3._8_4_;
      fStack_1a4 = auVar3._12_4_;
      *local_2d0 = CONCAT44(fStack_19c + fStack_1bc,local_1a0 + local_1c0);
      local_2d0[1] = CONCAT44(fStack_194 + fStack_1b4,fStack_198 + fStack_1b8);
      local_2d0[2] = CONCAT44(fStack_18c + fStack_1ac,fStack_190 + fStack_1b0);
      local_2d0[3] = CONCAT44(fStack_184 + fStack_1a4,fStack_188 + fStack_1a8);
      local_2c8 = local_2c8 + 1;
      local_2d0 = local_2d0 + 4;
    }
  }
  if (in_R8D == 4) {
    local_344 = 0;
    uVar5 = *in_RDI;
    uVar6 = in_RDI[1];
    while( true ) {
      local_160 = (float)uVar5;
      fStack_15c = (float)((ulong)uVar5 >> 0x20);
      fStack_158 = (float)uVar6;
      fStack_154 = (float)((ulong)uVar6 >> 0x20);
      if (in_ECX <= local_344 + 1) break;
      fVar1 = *local_2c8;
      fVar2 = local_2c8[1];
      *local_2d0 = CONCAT44(fStack_15c + fVar1,local_160 + fVar1);
      local_2d0[1] = CONCAT44(fStack_154 + fVar1,fStack_158 + fVar1);
      local_2d0[2] = CONCAT44(fStack_15c + fVar2,local_160 + fVar2);
      local_2d0[3] = CONCAT44(fStack_154 + fVar2,fStack_158 + fVar2);
      local_2c8 = local_2c8 + 2;
      local_2d0 = local_2d0 + 4;
      local_344 = local_344 + 2;
    }
    for (; local_344 < in_ECX; local_344 = local_344 + 1) {
      fVar1 = *local_2c8;
      *local_2d0 = CONCAT44(fStack_15c + fVar1,local_160 + fVar1);
      local_2d0[1] = CONCAT44(fStack_154 + fVar1,fStack_158 + fVar1);
      local_2c8 = local_2c8 + 1;
      local_2d0 = local_2d0 + 2;
    }
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb_a(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        int i = 0;
        __m512 _p = _mm512_loadu_ps(ptr);
        for (; i < w; i++)
        {
            __m512 _b = _mm512_set1_ps(*ptr1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr1 += 1;
            outptr += 16;
        }
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        int i = 0;
        __m256 _p = _mm256_loadu_ps(ptr);
#if __AVX512F__
        __m512 _p_512 = _mm512_insertf32x8(_mm512_castps256_ps512(_p), _p, 1);
        for (; i + 1 < w; i += 2)
        {
            __m256 _b0 = _mm256_set1_ps(ptr1[0]);
            __m256 _b1 = _mm256_set1_ps(ptr1[1]);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b0), _b1, 1);
            __m512 _outp = op.func_pack16(_p_512, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr1 += 2;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i < w; i++)
        {
            __m256 _b = _mm256_set1_ps(*ptr1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr1 += 1;
            outptr += 8;
        }
    }
#endif // __AVX__
    if (elempack == 4)
    {
        int i = 0;
        __m128 _p = _mm_loadu_ps(ptr);
#if __AVX__
        __m256 _p_256 = _mm256_insertf128_ps(_mm256_castps128_ps256(_p), _p, 1);
#if __AVX512F__
        __m512 _p_512 = _mm512_insertf32x8(_mm512_castps256_ps512(_p_256), _p_256, 1);
        for (; i + 3 < w; i += 4)
        {
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m128 _b2 = _mm_set1_ps(ptr1[2]);
            __m128 _b3 = _mm_set1_ps(ptr1[3]);
            __m256 _b01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _b23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b2), _b3, 1);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b01), _b23, 1);
            __m512 _outp = op.func_pack16(_p_512, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr1 += 4;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m256 _b = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _outp = op.func_pack8(_p_256, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr1 += 2;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < w; i++)
        {
            __m128 _b = _mm_set1_ps(*ptr1);
            __m128 _outp = op.func_pack4(_p, _b);
            _mm_storeu_ps(outptr, _outp);
            ptr1 += 1;
            outptr += 4;
        }
    }
#endif // __SSE2__
}